

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)__buf,&local_41);
  write(this,__fd,local_40,__n & 0xffffffff);
  sVar1 = std::__cxx11::string::~string(local_40);
  return sVar1;
}

Assistant:

void xr_ini_writer::write(const char *key, const char *value, bool enclose)
{
	write(key, std::string(value), enclose);
}